

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O3

QList<QFontDatabase::WritingSystem> * QFontDatabase::writingSystems(void)

{
  long lVar1;
  QtFontFamily *pQVar2;
  int iVar3;
  Type *pTVar4;
  undefined4 extraout_var;
  QtFontFamily **ppQVar5;
  ulong uVar6;
  long lVar7;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_> *in_RDI;
  uint x;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QDeadlineTimer QVar11;
  WritingSystem local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()(in_RDI);
  if (pTVar4 != (Type *)0x0) {
    QVar11.t2 = 0xffffffff;
    QVar11.type = 0x7fffffff;
    QVar11.t1 = (qint64)pTVar4;
    QRecursiveMutex::tryLock(QVar11);
  }
  QFontDatabasePrivate::ensureFontDatabase();
  if (QFontDatabasePrivate::instance::instance.count < 1) {
    uVar10 = 0;
  }
  else {
    lVar8 = 0;
    uVar10 = 0;
    ppQVar5 = QFontDatabasePrivate::instance::instance.families;
    do {
      pQVar2 = ppQVar5[lVar8];
      if ((undefined1  [112])((undefined1  [112])*pQVar2 & (undefined1  [112])0x1) ==
          (undefined1  [112])0x0) {
        iVar3 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
        (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x20))
                  ((long *)CONCAT44(extraout_var,iVar3),&pQVar2->name);
        ppQVar5 = QFontDatabasePrivate::instance::instance.families;
        if ((undefined1  [112])((undefined1  [112])*pQVar2 & (undefined1  [112])0x1) !=
            (undefined1  [112])0x0) goto LAB_0025abb2;
      }
      else {
LAB_0025abb2:
        if (pQVar2->count != 0) {
          lVar7 = 0;
          do {
            lVar1 = lVar7 + 1;
            uVar9 = 0;
            if ((pQVar2->writingSystems[lVar7 + 1] & 1) != 0) {
              uVar9 = 1L << ((byte)lVar1 & 0x3f);
            }
            uVar10 = uVar10 | uVar9;
            lVar7 = lVar1;
          } while (lVar1 != 0x21);
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < QFontDatabasePrivate::instance::instance.count);
  }
  uVar9 = 1;
  QRecursiveMutex::unlock();
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  uVar6 = uVar10 - (uVar10 >> 1 & 0x5555555555555555);
  uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
  QList<QFontDatabase::WritingSystem>::reserve
            ((QList<QFontDatabase::WritingSystem> *)in_RDI,
             ((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  do {
    if ((uVar10 >> (uVar9 & 0x3f) & 1) != 0) {
      local_3c = (WritingSystem)uVar9;
      QtPrivate::QPodArrayOps<QFontDatabase::WritingSystem>::emplace<QFontDatabase::WritingSystem&>
                ((QPodArrayOps<QFontDatabase::WritingSystem> *)in_RDI,*(qsizetype *)(in_RDI + 0x10),
                 &local_3c);
      QList<QFontDatabase::WritingSystem>::end((QList<QFontDatabase::WritingSystem> *)in_RDI);
    }
    uVar9 = uVar9 + 1;
  } while (uVar9 != 0x22);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QList<QFontDatabase::WritingSystem> *)in_RDI;
}

Assistant:

QList<QFontDatabase::WritingSystem> QFontDatabase::writingSystems()
{
    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    quint64 writingSystemsFound = 0;
    static_assert(WritingSystemsCount < 64);

    for (int i = 0; i < d->count; ++i) {
        QtFontFamily *family = d->families[i];
        if (!family->ensurePopulated())
            continue;

        if (family->count == 0)
            continue;
        for (uint x = Latin; x < uint(WritingSystemsCount); ++x) {
            if (family->writingSystems[x] & QtFontFamily::Supported)
                writingSystemsFound |= quint64(1) << x;
        }
    }

    // mutex protection no longer needed - just working on local data now:
    locker.unlock();

    QList<WritingSystem> list;
    list.reserve(qPopulationCount(writingSystemsFound));
    for (uint x = Latin ; x < uint(WritingSystemsCount); ++x) {
        if (writingSystemsFound & (quint64(1) << x))
            list.push_back(WritingSystem(x));
    }
    return list;
}